

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Glucose::Solver::litRedundant(Solver *this,Lit p,uint32_t abstract_levels)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  char *pcVar4;
  VarData *pVVar5;
  Lit tmp;
  uint uVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  Lit p_1;
  Lit local_48;
  Lit local_44;
  vec<Glucose::Lit> *local_40;
  vec<Glucose::Lit> *local_38;
  
  local_40 = &this->analyze_stack;
  if ((this->analyze_stack).data != (Lit *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  local_44.x = p.x;
  vec<Glucose::Lit>::push(local_40,&local_44);
  uVar6 = (this->analyze_stack).sz;
  bVar8 = (int)uVar6 < 1;
  if (0 < (int)uVar6) {
    local_38 = &this->analyze_toclear;
    iVar1 = (this->analyze_toclear).sz;
    lVar11 = (long)iVar1;
    do {
      puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      uVar2 = (this->vardata).data[(this->analyze_stack).data[(ulong)uVar6 - 1].x >> 1].reason;
      (this->analyze_stack).sz = uVar6 - 1;
      if ((puVar3[(ulong)uVar2 + 1] == 2) &&
         (uVar6 = puVar3[(ulong)uVar2 + 3],
         ((byte)uVar6 & 1 ^ (this->assigns).data[(int)uVar6 >> 1].value) == 1)) {
        puVar3[(ulong)uVar2 + 3] = puVar3[(ulong)uVar2 + 4];
        puVar3[(ulong)uVar2 + 4] = uVar6;
      }
      if (1 < (int)puVar3[(ulong)uVar2 + 1]) {
        lVar9 = 4;
        do {
          local_48.x = puVar3[(ulong)uVar2 + lVar9];
          iVar7 = local_48.x >> 1;
          pcVar4 = (this->seen).data;
          if (pcVar4[iVar7] == '\0') {
            pVVar5 = (this->vardata).data;
            uVar6 = pVVar5[iVar7].level;
            if (0 < (int)uVar6) {
              if ((pVVar5[iVar7].reason == 0xffffffff) ||
                 ((abstract_levels >> (uVar6 & 0x1f) & 1) == 0)) {
                iVar7 = (this->analyze_toclear).sz;
                if (iVar1 < iVar7) {
                  do {
                    (this->seen).data[(this->analyze_toclear).data[lVar11].x >> 1] = '\0';
                    lVar11 = lVar11 + 1;
                    iVar7 = (this->analyze_toclear).sz;
                  } while (lVar11 < iVar7);
                }
                if (iVar7 <= iVar1) {
                  return bVar8;
                }
                (this->analyze_toclear).sz = iVar1;
                return bVar8;
              }
              pcVar4[iVar7] = '\x01';
              vec<Glucose::Lit>::push(local_40,&local_48);
              vec<Glucose::Lit>::push(local_38,&local_48);
            }
          }
          lVar10 = lVar9 + -2;
          lVar9 = lVar9 + 1;
        } while (lVar10 < (int)puVar3[(ulong)uVar2 + 1]);
      }
      uVar6 = (this->analyze_stack).sz;
      bVar8 = (int)uVar6 < 1;
    } while (0 < (int)uVar6);
  }
  return bVar8;
}

Assistant:

bool Solver::litRedundant(Lit p, uint32_t abstract_levels) {
    analyze_stack.clear();
    analyze_stack.push(p);
    int top = analyze_toclear.size();
    while(analyze_stack.size() > 0) {
        assert(reason(var(analyze_stack.last())) != CRef_Undef);
        Clause &c = ca[reason(var(analyze_stack.last()))];
        analyze_stack.pop(); //
        if(c.size() == 2 && value(c[0]) == l_False) {
            assert(value(c[1]) == l_True);
            Lit tmp = c[0];
            c[0] = c[1], c[1] = tmp;
        }

        for(int i = 1; i < c.size(); i++) {
            Lit p = c[i];
            if(!seen[var(p)]) {
                if(level(var(p)) > 0) {
                    if(reason(var(p)) != CRef_Undef && (abstractLevel(var(p)) & abstract_levels) != 0) {
                        seen[var(p)] = 1;
                        analyze_stack.push(p);
                        analyze_toclear.push(p);
                    } else {
                        for(int j = top; j < analyze_toclear.size(); j++)
                            seen[var(analyze_toclear[j])] = 0;
                        analyze_toclear.shrink(analyze_toclear.size() - top);
                        return false;
                    }
                }
            }
        }
    }

    return true;
}